

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O1

cs_err Mips_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  Mips_init(MRI);
  ud->printer = Mips_printInst;
  ud->printer_info = MRI;
  ud->getinsn_info = MRI;
  ud->reg_name = Mips_reg_name;
  ud->insn_id = Mips_get_insn_id;
  ud->insn_name = Mips_insn_name;
  ud->group_name = Mips_group_name;
  ud->disasm = Mips_getInstruction;
  return CS_ERR_OK;
}

Assistant:

cs_err Mips_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	Mips_init(mri);
	ud->printer = Mips_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->reg_name = Mips_reg_name;
	ud->insn_id = Mips_get_insn_id;
	ud->insn_name = Mips_insn_name;
	ud->group_name = Mips_group_name;

	ud->disasm = Mips_getInstruction;

	return CS_ERR_OK;
}